

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O2

void __thiscall
SolverTest_DoubleOptionHelper_Test::~SolverTest_DoubleOptionHelper_Test
          (SolverTest_DoubleOptionHelper_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SolverTest, DoubleOptionHelper) {
  fmt::MemoryWriter w;
  OptionHelper<double>::Write(w, 4.2);
  EXPECT_EQ("4.2", w.str());
  const char *start = "1.23 ";
  const char *s = start;
  EXPECT_EQ(1.23, OptionHelper<double>::Parse(s));
  EXPECT_EQ(start + 4, s);
  EXPECT_EQ(4.2, OptionHelper<double>::CastArg(4.2));
}